

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subdivpatch1base.cpp
# Opt level: O2

void __thiscall
embree::SubdivPatch1Base::SubdivPatch1Base
          (SubdivPatch1Base *this,uint gID,uint pID,uint subPatch,SubdivMesh *mesh,size_t time,
          Vec2f *uv,float *edge_level,int *subdiv,int simd_width)

{
  HalfEdge *pHVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  PatchType PVar4;
  uint uVar5;
  uint uVar6;
  Topology *pTVar7;
  HalfEdge *pHVar8;
  BufferView<embree::Vec3fa> *pBVar9;
  char *pcVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  array_t<embree::CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>,_4UL> *paVar14;
  array_t<embree::CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>,_4UL> *paVar15;
  size_t i;
  ulong uVar16;
  DynamicStackArray<float,_16UL,_64UL> *pDVar17;
  DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *pDVar18;
  long lVar19;
  float *pfVar20;
  Vec3fa *pVVar21;
  DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *pDVar22;
  DynamicStackArray<float,_16UL,_64UL> *pDVar23;
  long lVar24;
  long lVar25;
  uint uVar26;
  HalfEdge *pHVar27;
  long lVar28;
  float fVar29;
  float fVar30;
  uint local_df8;
  uint local_df4;
  array_t<embree::CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>,_4UL> local_d80;
  
  (this->root_ref).data.super_atomic<long>.super___atomic_base<long>._M_i = 0;
  (this->mtx).flag.super_atomic<bool>._M_base._M_i = false;
  this->flags = '\0';
  this->type = '\0';
  this->geom = gID;
  this->prim = pID;
  this->time_ = (uint)time;
  pTVar7 = (mesh->topology).items;
  pHVar8 = (pTVar7->halfEdges).items;
  uVar26 = (pTVar7->mesh->faceStartEdge).items[pID];
  pHVar1 = pHVar8 + uVar26;
  PVar4 = pHVar8[uVar26].patch_type;
  if (PVar4 == REGULAR_QUAD_PATCH) {
    this->type = '\x01';
    pBVar9 = (mesh->vertices).items;
    array_t<embree::CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>,_4UL>::array_t(&local_d80);
    pcVar10 = pBVar9[time].super_RawBufferView.ptr_ofs;
    uVar16 = (ulong)(uint)pBVar9[time].super_RawBufferView.stride;
    paVar14 = &local_d80;
    paVar15 = &local_d80;
    for (lVar24 = 0; pDVar17 = &paVar14->items[0].crease_weight, pDVar22 = &paVar15->items[0].ring,
        lVar24 != 4; lVar24 = lVar24 + 1) {
      local_d80.items[lVar24].border_index = -1;
      uVar11 = *(undefined8 *)(pcVar10 + pHVar1[lVar24].vtx_index * uVar16 + 8);
      *(undefined8 *)&local_d80.items[lVar24].vtx.field_0 =
           *(undefined8 *)(pcVar10 + pHVar1[lVar24].vtx_index * uVar16);
      *(undefined8 *)((long)&local_d80.items[lVar24].vtx.field_0 + 8) = uVar11;
      local_d80.items[lVar24].vertex_crease_weight = pHVar1[lVar24].vertex_crease_weight;
      local_d80.items[lVar24].edge_level = pHVar1[lVar24].edge_level;
      local_d80.items[lVar24].vertex_level = 0.0;
      pHVar8 = pHVar1 + lVar24;
      pDVar23 = &local_d80.items[lVar24].crease_weight;
      pDVar18 = &local_d80.items[lVar24].ring;
      uVar26 = 0;
      local_df8 = 0xffffffff;
      pHVar27 = pHVar8;
      local_df4 = local_df8;
      do {
        fVar30 = local_d80.items[lVar24].vertex_level;
        fVar29 = pHVar27->edge_level;
        if (pHVar27->edge_level <= fVar30) {
          fVar29 = fVar30;
        }
        local_d80.items[lVar24].vertex_level = fVar29;
        fVar30 = pHVar27->edge_crease_weight;
        pfVar20 = local_d80.items[lVar24].crease_weight.data;
        if ((0x1f < uVar26) && ((DynamicStackArray<float,_16UL,_64UL> *)pfVar20 == pDVar23)) {
          pfVar20 = (float *)operator_new__(0x100);
          local_d80.items[lVar24].crease_weight.data = pfVar20;
          for (lVar25 = 0; lVar25 != 0x10; lVar25 = lVar25 + 1) {
            local_d80.items[lVar24].crease_weight.data[lVar25] = pDVar17->arr[lVar25];
          }
          pfVar20 = local_d80.items[lVar24].crease_weight.data;
        }
        pfVar20[uVar26 >> 1] = fVar30;
        lVar25 = (long)pHVar27->next_half_edge_ofs;
        uVar5 = pHVar27[lVar25].vtx_index;
        uVar11 = *(undefined8 *)(pcVar10 + uVar16 * uVar5);
        uVar12 = *(undefined8 *)(pcVar10 + uVar16 * uVar5 + 8);
        uVar6 = uVar26 + 1;
        pVVar21 = local_d80.items[lVar24].ring.data;
        if ((0x20 < uVar6) && ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar21 == pDVar18)
           ) {
          pVVar21 = (Vec3fa *)Vec3fa::operator_new__(0x800);
          local_d80.items[lVar24].ring.data = pVVar21;
          for (lVar28 = 0; lVar28 != 0x200; lVar28 = lVar28 + 0x10) {
            puVar2 = (undefined8 *)((long)&pDVar22->arr[0].field_0 + lVar28);
            uVar13 = puVar2[1];
            puVar3 = (undefined8 *)((long)&(local_d80.items[lVar24].ring.data)->field_0 + lVar28);
            *puVar3 = *puVar2;
            puVar3[1] = uVar13;
          }
          pVVar21 = local_d80.items[lVar24].ring.data;
        }
        *(undefined8 *)&pVVar21[uVar26].field_0 = uVar11;
        *(undefined8 *)((long)&pVVar21[uVar26].field_0 + 8) = uVar12;
        if (uVar5 < local_df8) {
          local_df8 = uVar5;
          local_df4 = uVar6 >> 1;
        }
        lVar28 = (long)pHVar27[lVar25].next_half_edge_ofs;
        uVar11 = *(undefined8 *)(pcVar10 + pHVar27[lVar25 + lVar28].vtx_index * uVar16);
        uVar12 = *(undefined8 *)(pcVar10 + pHVar27[lVar25 + lVar28].vtx_index * uVar16 + 8);
        uVar5 = uVar26 + 2;
        pVVar21 = local_d80.items[lVar24].ring.data;
        if ((0x20 < uVar5) && ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar21 == pDVar18)
           ) {
          pVVar21 = (Vec3fa *)Vec3fa::operator_new__(0x800);
          local_d80.items[lVar24].ring.data = pVVar21;
          for (lVar19 = 0; lVar19 != 0x200; lVar19 = lVar19 + 0x10) {
            puVar2 = (undefined8 *)((long)&pDVar22->arr[0].field_0 + lVar19);
            uVar13 = puVar2[1];
            puVar3 = (undefined8 *)((long)&(local_d80.items[lVar24].ring.data)->field_0 + lVar19);
            *puVar3 = *puVar2;
            puVar3[1] = uVar13;
          }
          pVVar21 = local_d80.items[lVar24].ring.data;
        }
        *(undefined8 *)&pVVar21[uVar6].field_0 = uVar11;
        *(undefined8 *)((long)&pVVar21[uVar6].field_0 + 8) = uVar12;
        if ((long)pHVar27[lVar25 + lVar28 + pHVar27[lVar25 + lVar28].next_half_edge_ofs].
                  opposite_half_edge_ofs == 0) {
          uVar6 = pHVar27[lVar25 + lVar28 + pHVar27[lVar25 + lVar28].next_half_edge_ofs].vtx_index;
          if (uVar6 < local_df8) {
            local_df8 = uVar6;
            local_df4 = uVar5 >> 1;
          }
          local_d80.items[lVar24].border_index = uVar5;
          pfVar20 = local_d80.items[lVar24].crease_weight.data;
          if ((0x1f < uVar5) && ((DynamicStackArray<float,_16UL,_64UL> *)pfVar20 == pDVar23)) {
            pfVar20 = (float *)operator_new__(0x100);
            local_d80.items[lVar24].crease_weight.data = pfVar20;
            for (lVar25 = 0; lVar25 != 0x10; lVar25 = lVar25 + 1) {
              local_d80.items[lVar24].crease_weight.data[lVar25] = pDVar17->arr[lVar25];
            }
            pfVar20 = local_d80.items[lVar24].crease_weight.data;
          }
          pfVar20[uVar5 >> 1] = INFINITY;
          uVar11 = *(undefined8 *)(pcVar10 + uVar6 * uVar16);
          uVar12 = *(undefined8 *)(pcVar10 + uVar6 * uVar16 + 8);
          uVar6 = uVar26 + 3;
          pVVar21 = local_d80.items[lVar24].ring.data;
          if ((0x20 < uVar6) &&
             ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar21 == pDVar18)) {
            pVVar21 = (Vec3fa *)Vec3fa::operator_new__(0x800);
            local_d80.items[lVar24].ring.data = pVVar21;
            for (lVar25 = 0; lVar25 != 0x200; lVar25 = lVar25 + 0x10) {
              puVar2 = (undefined8 *)((long)&pDVar22->arr[0].field_0 + lVar25);
              uVar13 = puVar2[1];
              puVar3 = (undefined8 *)((long)&(local_d80.items[lVar24].ring.data)->field_0 + lVar25);
              *puVar3 = *puVar2;
              puVar3[1] = uVar13;
            }
            pVVar21 = local_d80.items[lVar24].ring.data;
          }
          *(undefined8 *)&pVVar21[uVar5].field_0 = uVar11;
          *(undefined8 *)((long)&pVVar21[uVar5].field_0 + 8) = uVar12;
          uVar26 = uVar26 + 4;
          pVVar21 = local_d80.items[lVar24].ring.data;
          if ((0x20 < uVar26) &&
             ((DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)pVVar21 == pDVar18)) {
            pVVar21 = (Vec3fa *)Vec3fa::operator_new__(0x800);
            local_d80.items[lVar24].ring.data = pVVar21;
            for (lVar25 = 0; lVar25 != 0x200; lVar25 = lVar25 + 0x10) {
              puVar2 = (undefined8 *)((long)&pDVar22->arr[0].field_0 + lVar25);
              uVar11 = puVar2[1];
              puVar3 = (undefined8 *)((long)&(local_d80.items[lVar24].ring.data)->field_0 + lVar25);
              *puVar3 = *puVar2;
              puVar3[1] = uVar11;
            }
            pVVar21 = local_d80.items[lVar24].ring.data;
          }
          uVar11 = *(undefined8 *)((long)&local_d80.items[lVar24].vtx.field_0 + 8);
          *(undefined8 *)&pVVar21[uVar6].field_0 =
               *(undefined8 *)&local_d80.items[lVar24].vtx.field_0;
          *(undefined8 *)((long)&pVVar21[uVar6].field_0 + 8) = uVar11;
          for (pHVar27 = pHVar8; lVar25 = (long)pHVar27->opposite_half_edge_ofs, lVar25 != 0;
              pHVar27 = pHVar27 + lVar25 + pHVar27[lVar25].next_half_edge_ofs) {
          }
        }
        else {
          pHVar27 = pHVar27 + lVar25 + lVar28 + pHVar27[lVar25 + lVar28].next_half_edge_ofs +
                    pHVar27[lVar25 + lVar28 + pHVar27[lVar25 + lVar28].next_half_edge_ofs].
                    opposite_half_edge_ofs;
          uVar26 = uVar5;
        }
      } while (pHVar27 != pHVar8);
      local_d80.items[lVar24].edge_valence = uVar26;
      local_d80.items[lVar24].face_valence = uVar26 >> 1;
      local_d80.items[lVar24].eval_unique_identifier = local_df8;
      local_d80.items[lVar24].eval_start_index = local_df4;
      paVar14 = (array_t<embree::CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>,_4UL> *)
                (pDVar17 + 6);
      paVar15 = (array_t<embree::CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>,_4UL> *)
                (pDVar22 + 1);
    }
    BSplinePatchT<embree::Vec3fa,_embree::Vec3fa>::init
              ((BSplinePatchT<embree::Vec3fa,_embree::Vec3fa> *)this->patch_v,
               (EVP_PKEY_CTX *)&local_d80);
    array_t<embree::CatmullClark1RingT<embree::Vec3fa,_embree::Vec3fa>,_4UL>::~array_t(&local_d80);
  }
  else if (PVar4 == BILINEAR_PATCH) {
    this->type = '\x06';
    pBVar9 = (mesh->vertices).items;
    pcVar10 = pBVar9[time].super_RawBufferView.ptr_ofs;
    uVar16 = (ulong)(uint)pBVar9[time].super_RawBufferView.stride;
    uVar11 = *(undefined8 *)(pcVar10 + pHVar1->vtx_index * uVar16 + 8);
    *(undefined8 *)&this->patch_v[0][0].field_0 =
         *(undefined8 *)(pcVar10 + pHVar1->vtx_index * uVar16);
    *(undefined8 *)((long)&this->patch_v[0][0].field_0 + 8) = uVar11;
    lVar24 = (long)pHVar1->next_half_edge_ofs;
    uVar11 = *(undefined8 *)(pcVar10 + pHVar1[lVar24].vtx_index * uVar16 + 8);
    *(undefined8 *)&this->patch_v[0][1].field_0 =
         *(undefined8 *)(pcVar10 + pHVar1[lVar24].vtx_index * uVar16);
    *(undefined8 *)((long)&this->patch_v[0][1].field_0 + 8) = uVar11;
    lVar25 = (long)pHVar1[lVar24].next_half_edge_ofs;
    uVar11 = *(undefined8 *)(pcVar10 + pHVar1[lVar24 + lVar25].vtx_index * uVar16 + 8);
    *(undefined8 *)&this->patch_v[0][2].field_0 =
         *(undefined8 *)(pcVar10 + pHVar1[lVar24 + lVar25].vtx_index * uVar16);
    *(undefined8 *)((long)&this->patch_v[0][2].field_0 + 8) = uVar11;
    uVar11 = *(undefined8 *)
              (pcVar10 + pHVar1[lVar24 + lVar25 + pHVar1[lVar24 + lVar25].next_half_edge_ofs].
                         vtx_index * uVar16 + 8);
    *(undefined8 *)&this->patch_v[0][3].field_0 =
         *(undefined8 *)
          (pcVar10 +
          pHVar1[lVar24 + lVar25 + pHVar1[lVar24 + lVar25].next_half_edge_ofs].vtx_index * uVar16);
    *(undefined8 *)((long)&this->patch_v[0][3].field_0 + 8) = uVar11;
  }
  else {
    this->type = '\x05';
    pTVar7 = (mesh->topology).items;
    *(HalfEdge **)&this->patch_v[0][0].field_0 =
         (pTVar7->halfEdges).items + (pTVar7->mesh->faceStartEdge).items[pID];
    this->patch_v[0][0].field_0.m128[2] = (float)subPatch;
  }
  for (lVar24 = 0; lVar24 != 4; lVar24 = lVar24 + 1) {
    fVar30 = uv[lVar24].field_0.field_0.x * 8192.0;
    if (65535.0 <= fVar30) {
      fVar30 = 65535.0;
    }
    fVar29 = 0.0;
    if (0.0 <= fVar30) {
      fVar29 = fVar30;
    }
    this->u[lVar24] = (unsigned_short)(int)fVar29;
    fVar30 = uv[lVar24].field_0.field_0.y * 8192.0;
    if (65535.0 <= fVar30) {
      fVar30 = 65535.0;
    }
    fVar29 = 0.0;
    if (0.0 <= fVar30) {
      fVar29 = fVar30;
    }
    this->v[lVar24] = (unsigned_short)(int)fVar29;
  }
  updateEdgeLevels(this,edge_level,subdiv,(SubdivMesh *)&DAT_00000004,simd_width);
  return;
}

Assistant:

SubdivPatch1Base::SubdivPatch1Base (const unsigned int gID,
                                      const unsigned int pID,
                                      const unsigned int subPatch,
                                      const SubdivMesh *const mesh,
                                      const size_t time,
                                      const Vec2f uv[4],
                                      const float edge_level[4],
                                      const int subdiv[4],
                                      const int simd_width)
  : flags(0), type(INVALID_PATCH), geom(gID), prim(pID), time_(unsigned(time))
  {
    static_assert(sizeof(SubdivPatch1Base) == 5 * 64, "SubdivPatch1Base has wrong size");

    const HalfEdge* edge = mesh->getHalfEdge(0,pID);

    if (edge->patch_type == HalfEdge::BILINEAR_PATCH)
    {
      type = BILINEAR_PATCH;
      new (patch_v) BilinearPatch3fa(edge,mesh->getVertexBuffer(time));
    }
    else if (edge->patch_type == HalfEdge::REGULAR_QUAD_PATCH) 
    {
#if PATCH_USE_BEZIER_PATCH 
      type = BEZIER_PATCH;
      new (patch_v) BezierPatch3fa(BSplinePatch3fa(CatmullClarkPatch3fa(edge,mesh->getVertexBuffer(time))));
#else
      type = BSPLINE_PATCH;
      new (patch_v) BSplinePatch3fa(CatmullClarkPatch3fa(edge,mesh->getVertexBuffer(time))); // FIXME: init BSpline directly from half edge structure
#endif      
    }
#if PATCH_USE_GREGORY == 2
    else if (edge->patch_type == HalfEdge::IRREGULAR_QUAD_PATCH) 
    {
      type = GREGORY_PATCH;
      new (patch_v) DenseGregoryPatch3fa(GregoryPatch3fa(CatmullClarkPatch3fa(edge,mesh->getVertexBuffer(time))));
    }
#endif
    else
    {
      type = EVAL_PATCH;
      set_edge(mesh->getHalfEdge(0,pID));
      set_subPatch(subPatch);
    }